

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

IntersectClauseSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::IntersectClauseSyntax,slang::parsing::Token,slang::syntax::RangeListSyntax&>
          (BumpAllocator *this,Token *args,RangeListSyntax *args_1)

{
  Token intersect;
  IntersectClauseSyntax *pIVar1;
  BumpAllocator *in_RDX;
  Info *in_RSI;
  size_t in_stack_ffffffffffffffd8;
  size_t in_stack_ffffffffffffffe0;
  
  pIVar1 = (IntersectClauseSyntax *)
           allocate(in_RDX,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  intersect.info = in_RSI;
  intersect._0_8_ = in_RDX;
  slang::syntax::IntersectClauseSyntax::IntersectClauseSyntax
            ((IntersectClauseSyntax *)in_RSI->location,intersect,
             (RangeListSyntax *)in_RSI->rawTextPtr);
  return pIVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }